

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

void ctemplate_htmlparser::jsparser_buffer_append_chr(jsparser_ctx *js,char chr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined3 in_register_00000031;
  int iVar7;
  
  uVar4 = CONCAT31(in_register_00000031,chr);
  if (((uVar4 < 0x21) && ((0x100003e00U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) ||
     (uVar4 == 0xffffffa0)) {
    iVar3 = js->buffer_end;
    iVar7 = iVar3 - js->buffer_start;
    iVar5 = (iVar3 + 0x12) - js->buffer_start;
    if (-1 < iVar7) {
      iVar5 = iVar7;
    }
    if (0 < iVar5) {
      uVar6 = (iVar3 + -1) % 0x12;
      uVar4 = uVar6 + 0x12;
      if (-1 < (int)uVar6) {
        uVar4 = uVar6;
      }
      bVar1 = js->buffer[uVar4];
      if (((ulong)bVar1 < 0x21) && ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        return;
      }
      if (bVar1 == 0xa0) {
        return;
      }
    }
  }
  else {
    iVar3 = js->buffer_end;
  }
  js->buffer[iVar3] = chr;
  iVar3 = js->buffer_end + ((js->buffer_end + 1) / 0x12) * -0x12 + 1;
  js->buffer_end = iVar3;
  if (iVar3 != js->buffer_start) {
    return;
  }
  cVar2 = (char)iVar3 + '\x01';
  uVar4 = cVar2 * 0x39;
  js->buffer_start =
       (int)(char)(cVar2 + ((char)((uVar4 & 0xffff) >> 0xf) + (char)(uVar4 >> 10)) * -0x12);
  return;
}

Assistant:

void jsparser_buffer_append_chr(jsparser_ctx *js, char chr)
{
  /* Fold whitespace so we have enough space in the buffer. */
  if (js_is_whitespace(chr) &&
      js_is_whitespace(jsparser_buffer_get(js, -1))) {
    return;
  }

  js->buffer[js->buffer_end] = chr;
  js->buffer_end = (js->buffer_end + 1) % JSPARSER_RING_BUFFER_SIZE;
  if (js->buffer_end == js->buffer_start) {
    js->buffer_start = (js->buffer_end + 1) %
        JSPARSER_RING_BUFFER_SIZE;
  }
}